

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::PolyNode::IsHole(PolyNode *this)

{
  bool bVar1;
  PolyNode *local_20;
  PolyNode *node;
  bool result;
  PolyNode *this_local;
  
  bVar1 = true;
  for (local_20 = this->Parent; local_20 != (PolyNode *)0x0; local_20 = local_20->Parent) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  return bVar1;
}

Assistant:

bool PolyNode::IsHole() const
{ 
  bool result = true;
  PolyNode* node = Parent;
  while (node)
  {
      result = !result;
      node = node->Parent;
  }
  return result;
}